

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O3

int __thiscall pstore::file::in_memory::truncate(in_memory *this,char *__file,__off_t __length)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = (char *)this->eof_;
  if ((char *)this->length_ < pcVar1) {
    assert_failed("eof_ <= length_",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/file.cpp"
                  ,0x101);
  }
  pcVar2 = (char *)this->pos_;
  if (pcVar1 < pcVar2) {
    assert_failed("pos_ <= eof_",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/file.cpp"
                  ,0x102);
  }
  if (this->writable_ == false) {
    raise<std::errc>(permission_denied);
  }
  if (__file <= (char *)this->length_) {
    if (pcVar1 <= __file && (long)__file - (long)pcVar1 != 0) {
      memset(pcVar1 + (long)(this->buffer_).
                            super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0,
             (long)__file - (long)pcVar1);
      pcVar2 = (char *)this->pos_;
    }
    this->eof_ = (uint64_t)__file;
    if (pcVar2 < __file) {
      __file = pcVar2;
    }
    this->pos_ = (uint64_t)__file;
    return (int)pcVar2;
  }
  raise<std::errc>(invalid_argument);
}

Assistant:

void in_memory::truncate (std::uint64_t const size) {
            PSTORE_ASSERT (eof_ <= length_);
            PSTORE_ASSERT (pos_ <= eof_);
            this->check_writable ();

            if (size > length_) {
                raise (std::errc::invalid_argument);
            }
            if (size > eof_) {
                // Fill from the current end of file to the end of the newly available region.
                std::memset (buffer_.get () + eof_, 0, size - eof_);
            }
            eof_ = size;
            // Clamp pos inside the new file extent
            pos_ = std::min (pos_, eof_);
        }